

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnElemSegmentElemExpr_RefNull
          (BinaryReaderIR *this,Index segment_index,Type type)

{
  value_type pEVar1;
  size_type sVar2;
  reference ppEVar3;
  Type local_78;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_70;
  undefined1 local_68 [8];
  ExprList init_expr;
  Location loc;
  ElemSegment *segment;
  Index segment_index_local;
  BinaryReaderIR *this_local;
  Type type_local;
  
  unique0x100001c6 = type;
  sVar2 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::size
                    (&this->module_->elem_segments);
  if ((ulong)segment_index == sVar2 - 1) {
    ppEVar3 = std::vector<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>::operator[]
                        (&this->module_->elem_segments,(ulong)segment_index);
    pEVar1 = *ppEVar3;
    GetLocation((Location *)&init_expr.size_,this);
    intrusive_list<wabt::Expr>::intrusive_list((intrusive_list<wabt::Expr> *)local_68);
    std::make_unique<wabt::RefTypeExpr<(wabt::ExprType)37>,wabt::Type&,wabt::Location&>
              (&local_78,(Location *)((long)&this_local + 4));
    std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
    unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)37>,std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)37>>,void>
              ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_70,
               (unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)37>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)37>_>_>
                *)&local_78);
    intrusive_list<wabt::Expr>::push_back((intrusive_list<wabt::Expr> *)local_68,&local_70);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_70);
    std::
    unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)37>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)37>_>_>
    ::~unique_ptr((unique_ptr<wabt::RefTypeExpr<(wabt::ExprType)37>,_std::default_delete<wabt::RefTypeExpr<(wabt::ExprType)37>_>_>
                   *)&local_78);
    std::
    vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>::
    push_back(&pEVar1->elem_exprs,(value_type *)local_68);
    Result::Result((Result *)&type_local,Ok);
    intrusive_list<wabt::Expr>::~intrusive_list((intrusive_list<wabt::Expr> *)local_68);
    return (Result)type_local.enum_;
  }
  __assert_fail("segment_index == module_->elem_segments.size() - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-reader-ir.cc"
                ,0x519,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentElemExpr_RefNull(Index, Type)"
               );
}

Assistant:

Result BinaryReaderIR::OnElemSegmentElemExpr_RefNull(Index segment_index,
                                                     Type type) {
  assert(segment_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[segment_index];
  Location loc = GetLocation();
  ExprList init_expr;
  init_expr.push_back(std::make_unique<RefNullExpr>(type, loc));
  segment->elem_exprs.push_back(std::move(init_expr));
  return Result::Ok;
}